

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

string * common_chat_format_name_abi_cxx11_
                   (string *__return_storage_ptr__,common_chat_format format)

{
  runtime_error *this;
  char *pcVar1;
  char *pcVar2;
  
  switch(format) {
  case COMMON_CHAT_FORMAT_CONTENT_ONLY:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Content-only";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_GENERIC:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Generic";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_MISTRAL_NEMO:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Mistral Nemo";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_LLAMA_3_X:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Llama 3.x";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_LLAMA_3_X_WITH_BUILTIN_TOOLS:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Llama 3.x with builtin tools";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_DEEPSEEK_R1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "DeepSeek R1";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_DEEPSEEK_R1_EXTRACT_REASONING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "DeepSeek R1 (extract reasoning)";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_FIREFUNCTION_V2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "FireFunction v2";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Functionary v3.2";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_1_LLAMA_3_1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Functionary v3.1 Llama 3.1";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_HERMES_2_PRO:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Hermes 2 Pro";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_HERMES_2_PRO_EXTRACT_REASONING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Hermes 2 Pro (extract reasoning)";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_COMMAND_R7B:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Command R7B";
    pcVar1 = "";
    break;
  case COMMON_CHAT_FORMAT_COMMAND_R7B_EXTRACT_REASONING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Command R7B (extract reasoning)";
    pcVar1 = "";
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unknown chat format");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string common_chat_format_name(common_chat_format format) {
    switch (format) {
        case COMMON_CHAT_FORMAT_CONTENT_ONLY: return "Content-only";
        case COMMON_CHAT_FORMAT_GENERIC: return "Generic";
        case COMMON_CHAT_FORMAT_MISTRAL_NEMO: return "Mistral Nemo";
        case COMMON_CHAT_FORMAT_LLAMA_3_X: return "Llama 3.x";
        case COMMON_CHAT_FORMAT_LLAMA_3_X_WITH_BUILTIN_TOOLS: return "Llama 3.x with builtin tools";
        case COMMON_CHAT_FORMAT_DEEPSEEK_R1: return "DeepSeek R1";
        case COMMON_CHAT_FORMAT_DEEPSEEK_R1_EXTRACT_REASONING: return "DeepSeek R1 (extract reasoning)";
        case COMMON_CHAT_FORMAT_FIREFUNCTION_V2: return "FireFunction v2";
        case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_2: return "Functionary v3.2";
        case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_1_LLAMA_3_1: return "Functionary v3.1 Llama 3.1";
        case COMMON_CHAT_FORMAT_HERMES_2_PRO: return "Hermes 2 Pro";
        case COMMON_CHAT_FORMAT_HERMES_2_PRO_EXTRACT_REASONING: return "Hermes 2 Pro (extract reasoning)";
        case COMMON_CHAT_FORMAT_COMMAND_R7B: return "Command R7B";
        case COMMON_CHAT_FORMAT_COMMAND_R7B_EXTRACT_REASONING: return "Command R7B (extract reasoning)";
        default:
            throw std::runtime_error("Unknown chat format");
    }
}